

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<Neyn::Config> * __thiscall
pybind11::class_<Neyn::Config>::def_readwrite<Neyn::Config,std::__cxx11::string>
          (class_<Neyn::Config> *this,char *name,
          offset_in_Filer_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pm)

{
  cpp_function fset;
  cpp_function fget;
  type local_40;
  cpp_function local_38;
  is_method local_30;
  is_method local_28;
  
  local_30.class_.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  local_40.pm = pm;
  cpp_function::
  cpp_function<pybind11::class_<Neyn::Config>::def_readwrite<Neyn::Config,std::__cxx11::string>(char_const*,std::__cxx11::string_Neyn::Config::*)::_lambda(Neyn::Config_const&)_1_,pybind11::is_method,void>
            (&local_38,&local_40,&local_30);
  local_28.class_.m_ptr = (handle)(this->super_generic_type).super_object.super_handle.m_ptr;
  local_30.class_.m_ptr = (handle)(handle)pm;
  cpp_function::
  cpp_function<pybind11::class_<Neyn::Config>::def_readwrite<Neyn::Config,std::__cxx11::string>(char_const*,std::__cxx11::string_Neyn::Config::*)::_lambda(Neyn::Config&,std::__cxx11::string_const&)_1_,pybind11::is_method,void>
            ((cpp_function *)&local_40,(type *)&local_30,&local_28);
  local_30.class_.m_ptr._0_1_ = 6;
  def_property<pybind11::return_value_policy>
            (this,name,&local_38,(cpp_function *)&local_40,(return_value_policy *)&local_30);
  object::~object((object *)&local_40);
  object::~object((object *)&local_38);
  return this;
}

Assistant:

class_ &def_readwrite(const char *name, D C::*pm, const Extra&... extra) {
        static_assert(std::is_same<C, type>::value || std::is_base_of<C, type>::value, "def_readwrite() requires a class member (or base class member)");
        cpp_function fget([pm](const type &c) -> const D &{ return c.*pm; }, is_method(*this)),
                     fset([pm](type &c, const D &value) { c.*pm = value; }, is_method(*this));
        def_property(name, fget, fset, return_value_policy::reference_internal, extra...);
        return *this;
    }